

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDVertex * __thiscall ON_SubDEdgeChain::Vertex(ON_SubDEdgeChain *this,int vertex_index)

{
  int iVar1;
  ON_SubDEdgePtr *pOVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((-1 < vertex_index) &&
     (iVar1 = (this->m_edge_chain).m_count, 0 < iVar1 && vertex_index <= iVar1)) {
    pOVar2 = (this->m_edge_chain).m_a;
    if (iVar1 == vertex_index) {
      uVar3 = pOVar2[(ulong)(uint)vertex_index - 1].m_ptr;
      uVar4 = uVar3 & 0xfffffffffffffff8;
      if (uVar4 == 0) {
        return (ON_SubDVertex *)0x0;
      }
      uVar3 = (ulong)~(uint)uVar3;
    }
    else {
      uVar3 = pOVar2[(uint)vertex_index].m_ptr;
      uVar4 = uVar3 & 0xfffffffffffffff8;
      if (uVar4 == 0) {
        return (ON_SubDVertex *)0x0;
      }
    }
    return *(ON_SubDVertex **)(uVar4 + 0x80 + (ulong)((uint)uVar3 & 1) * 8);
  }
  return (ON_SubDVertex *)0x0;
}

Assistant:

const ON_SubDVertex* ON_SubDEdgeChain::Vertex(int vertex_index) const
{
  const int edge_count = m_edge_chain.Count();
  if ( vertex_index >= 0 && vertex_index <= edge_count && edge_count > 0 )
  {
    return 
      (vertex_index == edge_count)
      ? m_edge_chain[edge_count - 1].RelativeVertex(1)
      : m_edge_chain[vertex_index].RelativeVertex(0);
  }
  return nullptr;
}